

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void tcg_gen_cmp_vec_tricore
               (TCGContext_conflict9 *tcg_ctx,TCGCond cond,uint vece,TCGv_vec r,TCGv_vec a,
               TCGv_vec b)

{
  TCGType_conflict type_00;
  int iVar1;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGArg a0;
  TCGArg a_00;
  TCGArg b_00;
  TCGOpcode *n;
  undefined8 in_stack_ffffffffffffff80;
  undefined4 uVar2;
  TCGOpcode *hold_list;
  int can;
  TCGType_conflict type;
  TCGArg bi;
  TCGArg ai;
  TCGArg ri;
  TCGTemp *bt;
  TCGTemp *at;
  TCGTemp *rt;
  TCGv_vec b_local;
  TCGv_vec a_local;
  TCGv_vec r_local;
  uint vece_local;
  TCGCond cond_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  uVar2 = (undefined4)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  ts = tcgv_vec_temp(tcg_ctx,r);
  ts_00 = tcgv_vec_temp(tcg_ctx,a);
  ts_01 = tcgv_vec_temp(tcg_ctx,b);
  a0 = temp_arg(ts);
  a_00 = temp_arg(ts_00);
  b_00 = temp_arg(ts_01);
  type_00 = (TCGType_conflict)((ulong)*(undefined8 *)ts >> 0x10) & 0xff;
  tcg_assert_listed_vecop(INDEX_op_cmp_vec);
  iVar1 = tcg_can_emit_vec_op_tricore(tcg_ctx,INDEX_op_cmp_vec,type_00,vece);
  if (iVar1 < 1) {
    n = tcg_swap_vecop_list((TCGOpcode *)0x0);
    tcg_expand_vec_op_tricore
              (tcg_ctx,INDEX_op_cmp_vec,type_00,vece,a0,a_00,b_00,CONCAT44(uVar2,cond));
    tcg_swap_vecop_list(n);
  }
  else {
    vec_gen_4_tricore(tcg_ctx,INDEX_op_cmp_vec,type_00,vece,a0,a_00,b_00,(ulong)cond);
  }
  return;
}

Assistant:

void tcg_gen_cmp_vec(TCGContext *tcg_ctx, TCGCond cond, unsigned vece,
                     TCGv_vec r, TCGv_vec a, TCGv_vec b)
{
    TCGTemp *rt = tcgv_vec_temp(tcg_ctx, r);
    TCGTemp *at = tcgv_vec_temp(tcg_ctx, a);
    TCGTemp *bt = tcgv_vec_temp(tcg_ctx, b);
    TCGArg ri = temp_arg(rt);
    TCGArg ai = temp_arg(at);
    TCGArg bi = temp_arg(bt);
    TCGType type = rt->base_type;
    int can;

    tcg_debug_assert(at->base_type >= type);
    tcg_debug_assert(bt->base_type >= type);
    tcg_assert_listed_vecop(INDEX_op_cmp_vec);
    can = tcg_can_emit_vec_op(tcg_ctx, INDEX_op_cmp_vec, type, vece);
    if (can > 0) {
        vec_gen_4(tcg_ctx, INDEX_op_cmp_vec, type, vece, ri, ai, bi, cond);
    } else {
        const TCGOpcode *hold_list = tcg_swap_vecop_list(NULL);
        tcg_debug_assert(can < 0);
        tcg_expand_vec_op(tcg_ctx, INDEX_op_cmp_vec, type, vece, ri, ai, bi, cond);
        tcg_swap_vecop_list(hold_list);
    }
}